

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::InstanceIntersector1>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  ulong uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  byte bVar14;
  bool bVar15;
  bool bVar16;
  long lVar17;
  byte bVar18;
  byte bVar19;
  ulong *puVar20;
  ulong uVar21;
  InstancePrimitive *prim;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [64];
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2448 [16];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2378 == 8) {
    bVar15 = false;
  }
  else {
    local_2370[0] = 0;
    auVar24 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[0]));
    auVar43 = ZEXT3264(auVar24);
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_2448 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar2 = (context->query_radius).field_0;
      local_2448 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    }
    puVar20 = local_2368;
    auVar25 = vbroadcastss_avx512vl(ZEXT416((uint)(query->p).field_0.field_0.x));
    auVar26 = vbroadcastss_avx512vl(ZEXT416((uint)(query->p).field_0.field_0.y));
    auVar27 = vbroadcastss_avx512vl(ZEXT416((uint)(query->p).field_0.field_0.z));
    auVar28 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[1]));
    auVar45 = ZEXT3264(auVar28);
    auVar28 = vbroadcastss_avx512vl(ZEXT416((uint)(context->query_radius).field_0.m128[2]));
    auVar47 = ZEXT3264(auVar28);
    auVar23 = vmulss_avx512f(auVar24._0_16_,auVar24._0_16_);
    auVar24._0_4_ = auVar23._0_4_;
    auVar24._4_4_ = auVar24._0_4_;
    auVar24._8_4_ = auVar24._0_4_;
    auVar24._12_4_ = auVar24._0_4_;
    auVar24._16_4_ = auVar24._0_4_;
    auVar24._20_4_ = auVar24._0_4_;
    auVar24._24_4_ = auVar24._0_4_;
    auVar24._28_4_ = auVar24._0_4_;
    bVar15 = false;
    auVar28 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar48 = ZEXT3264(auVar28);
    auVar28 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar49 = ZEXT3264(auVar28);
    do {
      auVar42 = auVar43._0_32_;
      auVar28 = vsubps_avx512vl(auVar25,auVar42);
      auVar29 = vaddps_avx512vl(auVar25,auVar42);
      auVar44 = auVar45._0_32_;
      auVar30 = vsubps_avx512vl(auVar26,auVar44);
      auVar31 = vaddps_avx512vl(auVar26,auVar44);
      auVar46 = auVar47._0_32_;
      auVar32 = vsubps_avx512vl(auVar27,auVar46);
      auVar33 = vaddps_avx512vl(auVar27,auVar46);
LAB_01f326df:
      pfVar1 = (float *)(puVar20 + -1);
      puVar20 = puVar20 + -2;
      if (*pfVar1 <= (float)local_2448._0_4_) {
        uVar21 = *puVar20;
        do {
          do {
            if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
              if ((uVar21 & 8) != 0) {
LAB_01f32b74:
                lVar17 = (ulong)((uint)uVar21 & 0xf) - 8;
                if (lVar17 != 0) {
                  prim = (InstancePrimitive *)(uVar21 & 0xfffffffffffffff0);
                  bVar19 = 0;
                  do {
                    bVar18 = bVar19;
                    bVar16 = InstanceIntersector1::pointQuery(query,context,prim);
                    prim = prim + 1;
                    lVar17 = lVar17 + -1;
                    bVar19 = bVar18 | bVar16;
                  } while (lVar17 != 0);
                  if (bVar18 == 0 && !bVar16) {
                    auVar43 = ZEXT3264(auVar42);
                    auVar45 = ZEXT3264(auVar44);
                    auVar47 = ZEXT3264(auVar46);
                    auVar24 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                    auVar48 = ZEXT3264(auVar24);
                    auVar24 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                    auVar49 = ZEXT3264(auVar24);
                  }
                  else {
                    auVar24 = vbroadcastss_avx512vl
                                        (ZEXT416((uint)(context->query_radius).field_0.m128[0]));
                    auVar43 = ZEXT3264(auVar24);
                    auVar24 = vbroadcastss_avx512vl
                                        (ZEXT416((uint)(context->query_radius).field_0.m128[1]));
                    auVar45 = ZEXT3264(auVar24);
                    auVar24 = vbroadcastss_avx512vl
                                        (ZEXT416((uint)(context->query_radius).field_0.m128[2]));
                    auVar47 = ZEXT3264(auVar24);
                    auVar24 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                    auVar48 = ZEXT3264(auVar24);
                    auVar24 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                    auVar49 = ZEXT3264(auVar24);
                    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
                      local_2448 = ZEXT416((uint)(query->radius * query->radius));
                    }
                    else {
                      aVar2 = (context->query_radius).field_0;
                      local_2448 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
                    }
                    bVar15 = true;
                  }
                }
                goto LAB_01f32c86;
              }
              auVar34 = vmaxps_avx512vl(auVar25,*(undefined1 (*) [32])(uVar21 + 0x40));
              auVar34 = vminps_avx(auVar34,*(undefined1 (*) [32])(uVar21 + 0x60));
              auVar35 = vsubps_avx512vl(auVar34,auVar25);
              auVar34 = vmaxps_avx512vl(auVar26,*(undefined1 (*) [32])(uVar21 + 0x80));
              auVar34 = vminps_avx(auVar34,*(undefined1 (*) [32])(uVar21 + 0xa0));
              auVar36 = vsubps_avx512vl(auVar34,auVar26);
              auVar34 = vmaxps_avx512vl(auVar27,*(undefined1 (*) [32])(uVar21 + 0xc0));
              auVar34 = vminps_avx(auVar34,*(undefined1 (*) [32])(uVar21 + 0xe0));
              auVar34 = vsubps_avx512vl(auVar34,auVar27);
              auVar40._0_4_ =
                   auVar34._0_4_ * auVar34._0_4_ +
                   auVar36._0_4_ * auVar36._0_4_ + auVar35._0_4_ * auVar35._0_4_;
              auVar40._4_4_ =
                   auVar34._4_4_ * auVar34._4_4_ +
                   auVar36._4_4_ * auVar36._4_4_ + auVar35._4_4_ * auVar35._4_4_;
              auVar40._8_4_ =
                   auVar34._8_4_ * auVar34._8_4_ +
                   auVar36._8_4_ * auVar36._8_4_ + auVar35._8_4_ * auVar35._8_4_;
              auVar40._12_4_ =
                   auVar34._12_4_ * auVar34._12_4_ +
                   auVar36._12_4_ * auVar36._12_4_ + auVar35._12_4_ * auVar35._12_4_;
              auVar40._16_4_ =
                   auVar34._16_4_ * auVar34._16_4_ +
                   auVar36._16_4_ * auVar36._16_4_ + auVar35._16_4_ * auVar35._16_4_;
              auVar40._20_4_ =
                   auVar34._20_4_ * auVar34._20_4_ +
                   auVar36._20_4_ * auVar36._20_4_ + auVar35._20_4_ * auVar35._20_4_;
              auVar40._24_4_ =
                   auVar34._24_4_ * auVar34._24_4_ +
                   auVar36._24_4_ * auVar36._24_4_ + auVar35._24_4_ * auVar35._24_4_;
              auVar40._28_4_ = auVar36._28_4_ + auVar36._28_4_ + auVar35._28_4_;
              uVar22 = vcmpps_avx512vl(auVar40,auVar24,2);
              uVar6 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar21 + 0x40),
                                      *(undefined1 (*) [32])(uVar21 + 0x60),2);
              uVar22 = uVar22 & uVar6;
            }
            else {
              if ((uVar21 & 8) != 0) goto LAB_01f32b74;
              auVar34 = *(undefined1 (*) [32])(uVar21 + 0x40);
              auVar35 = *(undefined1 (*) [32])(uVar21 + 0x60);
              auVar36 = vmaxps_avx512vl(auVar25,auVar34);
              auVar36 = vminps_avx(auVar36,auVar35);
              auVar38 = vsubps_avx512vl(auVar36,auVar25);
              auVar36 = vmaxps_avx512vl(auVar26,*(undefined1 (*) [32])(uVar21 + 0x80));
              auVar36 = vminps_avx(auVar36,*(undefined1 (*) [32])(uVar21 + 0xa0));
              auVar37 = vsubps_avx512vl(auVar36,auVar26);
              auVar36 = vmaxps_avx512vl(auVar27,*(undefined1 (*) [32])(uVar21 + 0xc0));
              auVar36 = vminps_avx(auVar36,*(undefined1 (*) [32])(uVar21 + 0xe0));
              auVar36 = vsubps_avx512vl(auVar36,auVar27);
              auVar40._0_4_ =
                   auVar36._0_4_ * auVar36._0_4_ +
                   auVar37._0_4_ * auVar37._0_4_ + auVar38._0_4_ * auVar38._0_4_;
              auVar40._4_4_ =
                   auVar36._4_4_ * auVar36._4_4_ +
                   auVar37._4_4_ * auVar37._4_4_ + auVar38._4_4_ * auVar38._4_4_;
              auVar40._8_4_ =
                   auVar36._8_4_ * auVar36._8_4_ +
                   auVar37._8_4_ * auVar37._8_4_ + auVar38._8_4_ * auVar38._8_4_;
              auVar40._12_4_ =
                   auVar36._12_4_ * auVar36._12_4_ +
                   auVar37._12_4_ * auVar37._12_4_ + auVar38._12_4_ * auVar38._12_4_;
              auVar40._16_4_ =
                   auVar36._16_4_ * auVar36._16_4_ +
                   auVar37._16_4_ * auVar37._16_4_ + auVar38._16_4_ * auVar38._16_4_;
              auVar40._20_4_ =
                   auVar36._20_4_ * auVar36._20_4_ +
                   auVar37._20_4_ * auVar37._20_4_ + auVar38._20_4_ * auVar38._20_4_;
              auVar40._24_4_ =
                   auVar36._24_4_ * auVar36._24_4_ +
                   auVar37._24_4_ * auVar37._24_4_ + auVar38._24_4_ * auVar38._24_4_;
              auVar40._28_4_ = auVar37._28_4_ + auVar37._28_4_ + auVar38._28_4_;
              uVar13 = vcmpps_avx512vl(auVar34,auVar35,2);
              uVar7 = vcmpps_avx512vl(auVar35,auVar28,1);
              uVar8 = vcmpps_avx512vl(auVar34,auVar29,6);
              uVar9 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar21 + 0xa0),auVar30,1);
              uVar10 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar21 + 0x80),auVar31,6);
              uVar11 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar21 + 0xe0),auVar32,1);
              uVar12 = vcmpps_avx512vl(*(undefined1 (*) [32])(uVar21 + 0xc0),auVar33,6);
              uVar22 = (ulong)(byte)(~((byte)uVar10 | (byte)uVar8 | (byte)uVar12 | (byte)uVar7 |
                                      (byte)uVar9 | (byte)uVar11) & (byte)uVar13);
            }
            bVar19 = (byte)uVar22;
            if (bVar19 == 0) {
              if (puVar20 == &local_2378) {
                return bVar15;
              }
              goto LAB_01f326df;
            }
            auVar34 = *(undefined1 (*) [32])(uVar21 & 0xfffffffffffffff0);
            auVar35 = ((undefined1 (*) [32])(uVar21 & 0xfffffffffffffff0))[1];
            auVar36 = vmovdqa64_avx512vl(auVar48._0_32_);
            auVar36 = vpternlogd_avx512vl(auVar36,auVar40,auVar49._0_32_,0xf8);
            auVar37 = vpcompressd_avx512vl(auVar36);
            auVar38._0_4_ =
                 (uint)(bVar19 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar19 & 1) * auVar36._0_4_;
            bVar16 = (bool)((byte)(uVar22 >> 1) & 1);
            auVar38._4_4_ = (uint)bVar16 * auVar37._4_4_ | (uint)!bVar16 * auVar36._4_4_;
            bVar16 = (bool)((byte)(uVar22 >> 2) & 1);
            auVar38._8_4_ = (uint)bVar16 * auVar37._8_4_ | (uint)!bVar16 * auVar36._8_4_;
            bVar16 = (bool)((byte)(uVar22 >> 3) & 1);
            auVar38._12_4_ = (uint)bVar16 * auVar37._12_4_ | (uint)!bVar16 * auVar36._12_4_;
            bVar16 = (bool)((byte)(uVar22 >> 4) & 1);
            auVar38._16_4_ = (uint)bVar16 * auVar37._16_4_ | (uint)!bVar16 * auVar36._16_4_;
            bVar16 = (bool)((byte)(uVar22 >> 5) & 1);
            auVar38._20_4_ = (uint)bVar16 * auVar37._20_4_ | (uint)!bVar16 * auVar36._20_4_;
            bVar16 = (bool)((byte)(uVar22 >> 6) & 1);
            auVar38._24_4_ = (uint)bVar16 * auVar37._24_4_ | (uint)!bVar16 * auVar36._24_4_;
            bVar16 = SUB81(uVar22 >> 7,0);
            auVar38._28_4_ = (uint)bVar16 * auVar37._28_4_ | (uint)!bVar16 * auVar36._28_4_;
            auVar36 = vpermt2q_avx512vl(auVar34,auVar38,auVar35);
            uVar21 = auVar36._0_8_;
            bVar19 = bVar19 - 1 & bVar19;
          } while (bVar19 == 0);
          auVar36 = vpshufd_avx2(auVar38,0x55);
          vpermt2q_avx512vl(auVar34,auVar36,auVar35);
          auVar37 = vpminsd_avx2(auVar38,auVar36);
          auVar36 = vpmaxsd_avx2(auVar38,auVar36);
          bVar19 = bVar19 - 1 & bVar19;
          if (bVar19 == 0) {
            auVar38 = vpermi2q_avx512vl(auVar37,auVar34,auVar35);
            uVar21 = auVar38._0_8_;
            auVar34 = vpermt2q_avx512vl(auVar34,auVar36,auVar35);
            *puVar20 = auVar34._0_8_;
            auVar34 = vpermd_avx2(auVar36,auVar40);
            *(int *)(puVar20 + 1) = auVar34._0_4_;
            puVar20 = puVar20 + 2;
          }
          else {
            auVar5 = vpshufd_avx2(auVar38,0xaa);
            vpermt2q_avx512vl(auVar34,auVar5,auVar35);
            auVar3 = vpminsd_avx2(auVar37,auVar5);
            auVar37 = vpmaxsd_avx2(auVar37,auVar5);
            auVar5 = vpminsd_avx2(auVar36,auVar37);
            auVar36 = vpmaxsd_avx2(auVar36,auVar37);
            bVar19 = bVar19 - 1 & bVar19;
            if (bVar19 == 0) {
              auVar38 = vpermi2q_avx512vl(auVar3,auVar34,auVar35);
              uVar21 = auVar38._0_8_;
              auVar38 = vpermt2q_avx512vl(auVar34,auVar36,auVar35);
              *puVar20 = auVar38._0_8_;
              auVar36 = vpermd_avx2(auVar36,auVar40);
              *(int *)(puVar20 + 1) = auVar36._0_4_;
              auVar34 = vpermt2q_avx512vl(auVar34,auVar5,auVar35);
              puVar20[2] = auVar34._0_8_;
              auVar34 = vpermd_avx2(auVar5,auVar40);
              *(int *)(puVar20 + 3) = auVar34._0_4_;
              puVar20 = puVar20 + 4;
            }
            else {
              auVar37 = vpshufd_avx2(auVar38,0xff);
              vpermt2q_avx512vl(auVar34,auVar37,auVar35);
              auVar4 = vpminsd_avx2(auVar3,auVar37);
              auVar37 = vpmaxsd_avx2(auVar3,auVar37);
              auVar3 = vpminsd_avx2(auVar5,auVar37);
              auVar37 = vpmaxsd_avx2(auVar5,auVar37);
              auVar5 = vpminsd_avx2(auVar36,auVar37);
              auVar36 = vpmaxsd_avx2(auVar36,auVar37);
              bVar19 = bVar19 - 1 & bVar19;
              if (bVar19 == 0) {
                auVar38 = vpermi2q_avx512vl(auVar4,auVar34,auVar35);
                uVar21 = auVar38._0_8_;
                auVar38 = vpermt2q_avx512vl(auVar34,auVar36,auVar35);
                *puVar20 = auVar38._0_8_;
                auVar36 = vpermd_avx2(auVar36,auVar40);
                *(int *)(puVar20 + 1) = auVar36._0_4_;
                auVar36 = vpermt2q_avx512vl(auVar34,auVar5,auVar35);
                puVar20[2] = auVar36._0_8_;
                auVar36 = vpermd_avx2(auVar5,auVar40);
                *(int *)(puVar20 + 3) = auVar36._0_4_;
                auVar34 = vpermt2q_avx512vl(auVar34,auVar3,auVar35);
                puVar20[4] = auVar34._0_8_;
                auVar34 = vpermd_avx2(auVar3,auVar40);
                *(int *)(puVar20 + 5) = auVar34._0_4_;
                puVar20 = puVar20 + 6;
              }
              else {
                auVar39 = valignd_avx512vl(auVar38,auVar38,3);
                auVar38 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                auVar37 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                               CONCAT48(0x80000000,
                                                                        0x8000000080000000))),
                                            auVar38,auVar4);
                auVar38 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                auVar37 = vpermt2d_avx512vl(auVar37,auVar38,auVar3);
                auVar37 = vpermt2d_avx512vl(auVar37,auVar38,auVar5);
                auVar38 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                auVar36 = vpermt2d_avx512vl(auVar37,auVar38,auVar36);
                auVar41 = ZEXT3264(auVar36);
                bVar18 = bVar19;
                do {
                  auVar38 = auVar41._0_32_;
                  auVar36._8_4_ = 1;
                  auVar36._0_8_ = 0x100000001;
                  auVar36._12_4_ = 1;
                  auVar36._16_4_ = 1;
                  auVar36._20_4_ = 1;
                  auVar36._24_4_ = 1;
                  auVar36._28_4_ = 1;
                  auVar36 = vpermd_avx2(auVar36,auVar39);
                  auVar39 = valignd_avx512vl(auVar39,auVar39,1);
                  vpermt2q_avx512vl(auVar34,auVar39,auVar35);
                  bVar18 = bVar18 - 1 & bVar18;
                  uVar13 = vpcmpd_avx512vl(auVar36,auVar38,5);
                  auVar36 = vpmaxsd_avx2(auVar36,auVar38);
                  bVar14 = (byte)uVar13 << 1;
                  auVar38 = valignd_avx512vl(auVar38,auVar38,7);
                  bVar16 = (bool)((byte)uVar13 & 1);
                  auVar37._4_4_ = (uint)bVar16 * auVar38._4_4_ | (uint)!bVar16 * auVar36._4_4_;
                  auVar37._0_4_ = auVar36._0_4_;
                  bVar16 = (bool)(bVar14 >> 2 & 1);
                  auVar37._8_4_ = (uint)bVar16 * auVar38._8_4_ | (uint)!bVar16 * auVar36._8_4_;
                  bVar16 = (bool)(bVar14 >> 3 & 1);
                  auVar37._12_4_ = (uint)bVar16 * auVar38._12_4_ | (uint)!bVar16 * auVar36._12_4_;
                  bVar16 = (bool)(bVar14 >> 4 & 1);
                  auVar37._16_4_ = (uint)bVar16 * auVar38._16_4_ | (uint)!bVar16 * auVar36._16_4_;
                  bVar16 = (bool)(bVar14 >> 5 & 1);
                  auVar37._20_4_ = (uint)bVar16 * auVar38._20_4_ | (uint)!bVar16 * auVar36._20_4_;
                  bVar16 = (bool)(bVar14 >> 6 & 1);
                  auVar37._24_4_ = (uint)bVar16 * auVar38._24_4_ | (uint)!bVar16 * auVar36._24_4_;
                  auVar37._28_4_ =
                       (uint)(bVar14 >> 7) * auVar38._28_4_ |
                       (uint)!(bool)(bVar14 >> 7) * auVar36._28_4_;
                  auVar41 = ZEXT3264(auVar37);
                } while (bVar18 != 0);
                lVar17 = (ulong)(uint)POPCOUNT((uint)bVar19) + 3;
                do {
                  auVar36 = vpermi2q_avx512vl(auVar37,auVar34,auVar35);
                  *puVar20 = auVar36._0_8_;
                  auVar38 = auVar41._0_32_;
                  auVar36 = vpermd_avx2(auVar38,auVar40);
                  *(int *)(puVar20 + 1) = auVar36._0_4_;
                  auVar37 = valignd_avx512vl(auVar38,auVar38,1);
                  puVar20 = puVar20 + 2;
                  auVar41 = ZEXT3264(auVar37);
                  lVar17 = lVar17 + -1;
                } while (lVar17 != 0);
                auVar34 = vpermt2q_avx512vl(auVar34,auVar37,auVar35);
                uVar21 = auVar34._0_8_;
              }
            }
          }
        } while( true );
      }
LAB_01f32c86:
      auVar24 = vmulps_avx512vl(auVar43._0_32_,auVar43._0_32_);
    } while (puVar20 != &local_2378);
  }
  return bVar15;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }